

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O3

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  stbrp_context *psVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int extraout_EAX;
  ulong uVar11;
  stbrp_node **ppsVar12;
  long extraout_RAX;
  long lVar13;
  int iVar14;
  stbrp_node *psVar15;
  stbrp_context *psVar16;
  uint uVar17;
  stbrp_node *in_R8;
  stbrp_node *psVar18;
  stbrp_rect *psVar19;
  stbrp_node *psVar20;
  stbrp_context *c;
  ulong __nmemb;
  size_t sVar21;
  int iVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  int waste;
  uint local_98;
  int local_94;
  stbrp_node *local_88;
  uint local_70;
  int local_60;
  int local_5c;
  ulong local_58;
  ulong local_50;
  stbrp_rect *local_48;
  ulong local_40;
  stbrp_rect *local_38;
  
  __nmemb = (ulong)(uint)num_rects;
  if (num_rects < 1) {
    __nmemb = (ulong)num_rects;
    qsort(rects,__nmemb,0x10,rect_height_compare);
  }
  else {
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar26 = vpmovsxbd_avx512f(_DAT_002914b0);
    auVar27 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar28 = vpbroadcastd_avx512f(ZEXT416(0x10));
    uVar11 = (ulong)(num_rects + 0xfU & 0xfffffff0);
    auVar29 = vpbroadcastq_avx512f();
    do {
      uVar5 = vpcmpuq_avx512f(auVar25,auVar29,2);
      auVar30 = vpsllq_avx512f(auVar25,4);
      uVar6 = vpcmpuq_avx512f(auVar24,auVar29,2);
      auVar31 = vpsllq_avx512f(auVar24,4);
      auVar23 = vextracti64x4_avx512f(auVar26,1);
      auVar25 = vpaddq_avx512f(auVar25,auVar27);
      auVar24 = vpaddq_avx512f(auVar24,auVar27);
      uVar11 = uVar11 - 0x10;
      vpscatterqd_avx512f(ZEXT832(rects) + ZEXT832(0xc) + auVar30._0_32_,uVar5,auVar26._0_32_);
      auVar26 = vpaddd_avx512f(auVar26,auVar28);
      vpscatterqd_avx512f(ZEXT832(rects) + ZEXT832(0xc) + auVar31._0_32_,uVar6,auVar23);
    } while (uVar11 != 0);
    qsort(rects,__nmemb,0x10,rect_height_compare);
    if (0 < num_rects) {
      sVar21 = 0;
      ppsVar12 = &context->active_head;
      local_58 = __nmemb;
      local_50 = __nmemb;
      local_48 = rects;
      do {
        uVar1 = rects[sVar21].w;
        psVar19 = rects + sVar21;
        if ((uVar1 == 0) || (uVar2 = psVar19->h, uVar2 == 0)) {
          psVar19->x = 0;
          psVar19->y = 0;
        }
        else {
          iVar10 = context->width;
          iVar22 = (uVar1 - 1) + context->align;
          iVar22 = iVar22 - iVar22 % context->align;
          if (iVar22 <= iVar10) {
            iVar4 = context->height;
            local_70 = (uint)uVar2;
            if ((int)local_70 <= iVar4) {
              c = (stbrp_context *)*ppsVar12;
              uVar3 = (ushort)c->width;
              local_40 = (ulong)uVar1;
              local_38 = psVar19;
              if (iVar10 < (int)(iVar22 + (uint)uVar3)) {
                local_98 = 0x40000000;
                local_88 = (stbrp_node *)0x0;
                local_94 = 0x40000000;
                iVar14 = context->heuristic;
                uVar8 = 0;
              }
              else {
                local_98 = 0x40000000;
                local_88 = (stbrp_node *)0x0;
                local_94 = 0x40000000;
                psVar16 = c;
                psVar20 = (stbrp_node *)ppsVar12;
                uVar1 = uVar3;
                do {
                  uVar8 = stbrp__skyline_find_min_y
                                    (psVar16,(stbrp_node *)(ulong)uVar1,iVar22,(int)&local_5c,
                                     (int *)in_R8);
                  iVar14 = context->heuristic;
                  if (iVar14 == 0) {
                    if ((int)uVar8 < (int)local_98) {
                      local_98 = uVar8;
                      local_88 = psVar20;
                    }
                  }
                  else if (((int)(uVar2 + uVar8) <= iVar4) &&
                          (((int)uVar8 < (int)local_98 || (local_5c < local_94 && uVar8 == local_98)
                           ))) {
                    local_94 = local_5c;
                    local_98 = uVar8;
                    local_88 = psVar20;
                  }
                  psVar20 = (stbrp_node *)&psVar16->align;
                  uVar1 = (ushort)(*(stbrp_context **)&psVar16->align)->width;
                  psVar16 = *(stbrp_context **)&psVar16->align;
                } while ((int)(iVar22 + (uint)uVar1) <= iVar10);
                if (local_88 == (stbrp_node *)0x0) {
                  local_88 = (stbrp_node *)0x0;
                  uVar8 = 0;
                }
                else {
                  uVar8 = (uint)(*(stbrp_node **)local_88)->x;
                }
              }
              psVar16 = c;
              if (iVar14 == 1) {
                while (psVar20 = (stbrp_node *)ppsVar12, (int)(uint)uVar3 < iVar22) {
                  uVar3 = (ushort)(*(stbrp_context **)&psVar16->align)->width;
                  psVar16 = *(stbrp_context **)&psVar16->align;
                }
                do {
                  uVar17 = (uint)(ushort)psVar16->width - iVar22;
                  psVar18 = psVar20;
                  psVar7 = c;
                  do {
                    c = psVar7;
                    psVar20 = psVar18;
                    psVar18 = (stbrp_node *)&c->align;
                    psVar7 = *(stbrp_context **)&c->align;
                  } while ((int)(uint)(ushort)(*(stbrp_context **)&c->align)->width <= (int)uVar17);
                  uVar9 = stbrp__skyline_find_min_y
                                    (c,(stbrp_node *)(ulong)uVar17,iVar22,(int)&local_60,
                                     (int *)in_R8);
                  if ((((int)(uVar2 + uVar9) <= iVar4) && ((int)uVar9 <= (int)local_98)) &&
                     (((uVar9 < local_98 || (local_60 < local_94)) ||
                      ((local_60 == local_94 && ((int)uVar17 < (int)uVar8)))))) {
                    local_94 = local_60;
                    local_98 = uVar9;
                    local_88 = psVar20;
                    uVar8 = uVar17;
                  }
                  psVar16 = *(stbrp_context **)&psVar16->align;
                } while (psVar16 != (stbrp_context *)0x0);
              }
              in_R8 = local_88;
              psVar19 = local_38;
              rects = local_48;
              __nmemb = local_50;
              if (((local_88 != (stbrp_node *)0x0) && (iVar10 = uVar2 + local_98, iVar10 <= iVar4))
                 && (psVar20 = context->free_head, psVar20 != (stbrp_node *)0x0)) {
                psVar20->x = (stbrp_coord)uVar8;
                psVar20->y = (stbrp_coord)iVar10;
                context->free_head = psVar20->next;
                psVar18 = *(stbrp_node **)local_88;
                psVar15 = psVar18;
                if ((int)(uint)psVar18->x < (int)uVar8) {
                  psVar15 = psVar18->next;
                  local_88 = (stbrp_node *)&psVar18->next;
                }
                *(stbrp_node **)local_88 = psVar20;
                iVar10 = uVar8 + (int)local_40;
                in_R8 = psVar15->next;
                if (in_R8 != (stbrp_node *)0x0) {
                  do {
                    psVar18 = in_R8;
                    in_R8 = (stbrp_node *)(ulong)psVar18->x;
                    if (iVar10 < (int)(uint)psVar18->x) goto LAB_0024666b;
                    psVar15->next = context->free_head;
                    context->free_head = psVar15;
                    psVar15 = psVar18;
                    in_R8 = psVar18->next;
                  } while (psVar18->next != (stbrp_node *)0x0);
                  in_R8 = (stbrp_node *)0x0;
                }
LAB_0024666b:
                psVar20->next = psVar15;
                if ((int)(uint)psVar15->x < iVar10) {
                  psVar15->x = (stbrp_coord)iVar10;
                }
                local_38->x = (stbrp_coord)uVar8;
                local_38->y = (stbrp_coord)local_98;
                goto LAB_0024665a;
              }
            }
          }
          psVar19->x = 0xffff;
          psVar19->y = 0xffff;
        }
LAB_0024665a:
        sVar21 = sVar21 + 1;
        if (sVar21 == __nmemb) {
          qsort(rects,__nmemb,0x10,rect_original_order);
          lVar13 = extraout_RAX;
          if (0 < (int)local_58) {
            lVar13 = 0;
            do {
              uVar8 = 1;
              if (*(short *)((long)&rects->x + lVar13) == -1) {
                uVar8 = (uint)(*(short *)((long)&rects->y + lVar13) != -1);
              }
              *(uint *)((long)&rects->was_packed + lVar13) = uVar8;
              lVar13 = lVar13 + 0x10;
            } while (__nmemb * 0x10 != lVar13);
          }
          return (int)lVar13;
        }
      } while( true );
    }
  }
  qsort(rects,__nmemb,0x10,rect_original_order);
  return extraout_EAX;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}